

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O0

void __thiscall Minisat::OnlineProofChecker::uncheckedEnqueue(OnlineProofChecker *this,Lit p)

{
  int iVar1;
  ostream *poVar2;
  vec<Minisat::lbool> *this_00;
  lbool *plVar3;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  size_t *in_RDX;
  size_t *extraout_RDX;
  code *in_RSI;
  ostream *in_RDI;
  size_t in_R8;
  undefined4 in_stack_ffffffffffffffe0;
  Lit LVar4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  lbool lVar5;
  Lit local_4;
  
  local_4.x = (int)in_RSI;
  if (3 < *(int *)(in_RDI + 0xf8)) {
    poVar2 = in_RDI;
    std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] enqueue literal ");
    poVar2 = operator<<(poVar2,(Lit *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
    ;
    in_RSI = std::endl<char,std::char_traits<char>>;
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    in_RDX = extraout_RDX;
  }
  lVar5.value = (uint8_t)((uint)in_stack_ffffffffffffffec >> 0x18);
  iVar1 = sign((EVP_PKEY_CTX *)(ulong)(uint)local_4.x,(uchar *)in_RSI,in_RDX,
               (uchar *)CONCAT71(in_register_00000009,in_CL),in_R8);
  lbool::lbool((lbool *)&stack0xffffffffffffffef,(bool)(((byte)iVar1 ^ 0xff) & 1));
  this_00 = (vec<Minisat::lbool> *)(in_RDI + 0xd8);
  LVar4.x = local_4.x;
  iVar1 = var(local_4);
  plVar3 = vec<Minisat::lbool>::operator[](this_00,iVar1);
  plVar3->value = lVar5.value;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::operator[]
            ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
             CONCAT44(LVar4.x,in_stack_ffffffffffffffe0),(Lit *)in_RDI);
  vec<Minisat::Lit>::push_((vec<Minisat::Lit> *)(in_RDI + 0xb8),&local_4);
  return;
}

Assistant:

inline void OnlineProofChecker::uncheckedEnqueue(Lit p)
{
    DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] enqueue literal " << p << std::endl;);
    assigns[var(p)] = lbool(!sign(p));
    // prefetch watch lists
    __builtin_prefetch(&watches[p]);
    trail.push_(p);
}